

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Function * __thiscall Parser::function(Parser *this)

{
  bool bVar1;
  ExprNode *this_00;
  Function *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  Token local_388;
  string local_318;
  Statements *local_2f8;
  Statements *statements;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  Token colon;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  Token closeParen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  Token openParen;
  ExprNode *id;
  Token def;
  Parser *this_local;
  
  def._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)&id,this->tokenizer);
  this_00 = variableID(this);
  Tokenizer::getToken((Token *)local_108,this->tokenizer);
  bVar1 = Token::isOpenParen((Token *)local_108);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"Parser::functionDef",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Expected an ( sign, instead got",
               (allocator<char> *)
               ((long)&params.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    die(this,&local_128,&local_150,(Token *)local_108);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&params.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  parameterList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&closeParen._string.field_2 + 8),this);
  Tokenizer::getToken((Token *)local_1e0,this->tokenizer);
  bVar1 = Token::isCloseParen((Token *)local_1e0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"Parser::functionDef",&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Expected an ) sign, instead got",
               (allocator<char> *)(colon._string.field_2._M_local_buf + 0xf));
    die(this,&local_200,&local_228,(Token *)local_1e0);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)(colon._string.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  Tokenizer::getToken((Token *)local_2a0,this->tokenizer);
  bVar1 = Token::isCloseParen((Token *)local_1e0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"Parser::functionDef",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"Expected an : sign, instead got",
               (allocator<char> *)((long)&statements + 7));
    die(this,&local_2c0,&local_2e8,(Token *)local_2a0);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&statements + 7));
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
  }
  local_2f8 = suite(this);
  this_01 = (Function *)operator_new(0x88);
  ExprNode::token(&local_388,this_00);
  Token::getName_abi_cxx11_(&local_318,&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&closeParen._string.field_2 + 8));
  Function::Function(this_01,&local_318,&local_3a0,local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0);
  std::__cxx11::string::~string((string *)&local_318);
  Token::~Token(&local_388);
  Token::~Token((Token *)local_2a0);
  Token::~Token((Token *)local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&closeParen._string.field_2 + 8));
  Token::~Token((Token *)local_108);
  Token::~Token((Token *)&id);
  return this_01;
}

Assistant:

Function *Parser::function(){
    Token def = tokenizer.getToken();
    ExprNode *id = variableID();
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::functionDef", "Expected an ( sign, instead got", openParen);
    //Parameter List
    std::vector<std::string>params = parameterList();
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::functionDef", "Expected an ) sign, instead got", closeParen);
    Token colon = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::functionDef", "Expected an : sign, instead got", colon);
    Statements *statements = suite();
    return new Function(id->token().getName(),params,statements);

}